

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

void opj_tgt_encode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  opj_tgt_node *poVar1;
  int iVar2;
  int iVar3;
  opj_tgt_node_t *poVar4;
  opj_tgt_node_t **ppoVar5;
  opj_tgt_node_t *stk [31];
  
  ppoVar5 = stk;
  poVar4 = tree->nodes + leafno;
  while (poVar1 = poVar4->parent, poVar1 != (opj_tgt_node *)0x0) {
    *ppoVar5 = poVar4;
    ppoVar5 = ppoVar5 + 1;
    poVar4 = poVar1;
  }
  iVar2 = 0;
  do {
    iVar3 = poVar4->low;
    if (poVar4->low < iVar2) {
      poVar4->low = iVar2;
      iVar3 = iVar2;
    }
    iVar2 = iVar3;
    if (iVar3 <= threshold) {
      iVar2 = threshold;
    }
    for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
      if (poVar4->value <= iVar3) {
        iVar2 = iVar3;
        if (poVar4->known == 0) {
          opj_bio_putbit(bio,1);
          poVar4->known = 1;
        }
        break;
      }
      opj_bio_putbit(bio,0);
    }
    poVar4->low = iVar2;
    if (ppoVar5 == stk) {
      return;
    }
    poVar4 = ppoVar5[-1];
    ppoVar5 = ppoVar5 + -1;
  } while( true );
}

Assistant:

void opj_tgt_encode(opj_bio_t *bio, opj_tgt_tree_t *tree, OPJ_UINT32 leafno,
                    OPJ_INT32 threshold)
{
    opj_tgt_node_t *stk[31];
    opj_tgt_node_t **stkptr;
    opj_tgt_node_t *node;
    OPJ_INT32 low;

    stkptr = stk;
    node = &tree->nodes[leafno];
    while (node->parent) {
        *stkptr++ = node;
        node = node->parent;
    }

    low = 0;
    for (;;) {
        if (low > node->low) {
            node->low = low;
        } else {
            low = node->low;
        }

        while (low < threshold) {
            if (low >= node->value) {
                if (!node->known) {
                    opj_bio_putbit(bio, 1);
                    node->known = 1;
                }
                break;
            }
            opj_bio_putbit(bio, 0);
            ++low;
        }

        node->low = low;
        if (stkptr == stk) {
            break;
        }
        node = *--stkptr;
    }
}